

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

int __thiscall
lossless_neural_sound::expression_compiler::expression::Product::structurally_compare_implementation
          (Product *this,Expression_node *rt)

{
  _func_int **pp_Var1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (rt == (Expression_node *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x4e8,
                  "virtual int lossless_neural_sound::expression_compiler::expression::Product::structurally_compare_implementation(const Expression_node *) const"
                 );
  }
  pp_Var1 = (rt->super_Node)._vptr_Node;
  if (pp_Var1 != (_func_int **)&PTR__Node_0012e8f0) {
    uVar2 = (*pp_Var1[6])(rt);
    uVar3 = 0xffffffff;
    if (uVar2 < 4) {
      uVar3 = (uint)(uVar2 != 3);
    }
    return uVar3;
  }
  iVar4 = Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
          structurally_compare_tree
                    (&this->
                      super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>
                     ,(Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>
                       *)rt);
  return iVar4;
}

Assistant:

virtual int structurally_compare_implementation(const Expression_node *rt) const
        noexcept override
    {
        assert(rt);
        if(auto *product = dynamic_cast<const Product *>(rt))
        {
            return structurally_compare_tree(product);
        }
        auto rt_kind = rt->get_kind();
        if(Kind::Product < rt_kind)
            return -1;
        if(Kind::Product > rt_kind)
            return 1;
        return 0;
    }